

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ExceptionTranslatorRegistry::registerTranslator
          (ExceptionTranslatorRegistry *this,IExceptionTranslator *translator)

{
  __uniq_ptr_impl<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_const_Catch::IExceptionTranslator_*,_std::default_delete<const_Catch::IExceptionTranslator>_>
  .super__Head_base<0UL,_const_Catch::IExceptionTranslator_*,_false>._M_head_impl =
       (tuple<const_Catch::IExceptionTranslator_*,_std::default_delete<const_Catch::IExceptionTranslator>_>
        )(tuple<const_Catch::IExceptionTranslator_*,_std::default_delete<const_Catch::IExceptionTranslator>_>
          )translator;
  std::
  vector<std::unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>,std::allocator<std::unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>>>
  ::
  emplace_back<std::unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>>
            ((vector<std::unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>,std::allocator<std::unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>>>
              *)&this->m_translators,
             (unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>
              *)&local_10);
  if ((_Tuple_impl<0UL,_const_Catch::IExceptionTranslator_*,_std::default_delete<const_Catch::IExceptionTranslator>_>
       )local_10._M_t.
        super__Tuple_impl<0UL,_const_Catch::IExceptionTranslator_*,_std::default_delete<const_Catch::IExceptionTranslator>_>
        .super__Head_base<0UL,_const_Catch::IExceptionTranslator_*,_false>._M_head_impl !=
      (IExceptionTranslator *)0x0) {
    (*(*(_func_int ***)
        local_10._M_t.
        super__Tuple_impl<0UL,_const_Catch::IExceptionTranslator_*,_std::default_delete<const_Catch::IExceptionTranslator>_>
        .super__Head_base<0UL,_const_Catch::IExceptionTranslator_*,_false>._M_head_impl)[1])();
  }
  return;
}

Assistant:

void ExceptionTranslatorRegistry::registerTranslator( const IExceptionTranslator* translator ) {
        m_translators.push_back( std::unique_ptr<const IExceptionTranslator>( translator ) );
    }